

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.h
# Opt level: O2

bool __thiscall Clasp::Solver::CmpScore::isFrozen(CmpScore *this,ConstraintScore *a)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = a->rep;
  if ((uVar1 >> 0x1b & 1) == 0) {
    return false;
  }
  uVar2 = 0x7f;
  if ((uVar1 & 0x7f00000) != 0) {
    uVar2 = uVar1 >> 0x14 & 0x7f;
  }
  return uVar2 <= this->freeze;
}

Assistant:

bool   hasLbd()   const  { return (rep & LBD_MASK) != 0; }